

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

void r8vec_unit_sum(int n,double *a)

{
  ulong uVar1;
  double dVar2;
  
  if (0 < n) {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + a[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      if (0 < n) {
        uVar1 = 0;
        do {
          a[uVar1] = a[uVar1] / dVar2;
          uVar1 = uVar1 + 1;
        } while ((uint)n != uVar1);
      }
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"R8VEC_UNIT_SUM - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  The vector entries sum to 0.\n");
  exit(1);
}

Assistant:

void r8vec_unit_sum ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_UNIT_SUM normalizes an R8VEC to have unit sum.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input/output, double A[N], the vector to be normalized.
//    On output, the entries of A should have unit sum.  However, if
//    the input vector has zero sum, the routine halts.
//
{
  double a_sum;
  int i;

  a_sum = 0.0;
  for ( i = 0; i < n; i++ )
  {
    a_sum = a_sum + a[i];
  }

  if ( a_sum == 0.0 )
  {
    cerr << "\n";
    cerr << "R8VEC_UNIT_SUM - Fatal error!\n";
    cerr << "  The vector entries sum to 0.\n";
    exit ( 1 );
  }

  for ( i = 0; i < n; i++ )
  {
    a[i] = a[i] / a_sum;
  }

  return;
}